

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall
Args::HelpPrinter::printString
          (HelpPrinter *this,OutStreamType *to,StringList *words,size_type currentPos,
          size_type leftMargin,size_type rightMargin)

{
  anon_class_64_8_a3d8de13 __f;
  ulong uVar1;
  undefined8 in_RCX;
  ostream *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool makeOffset;
  size_type length;
  size_type maxLineLength;
  size_type occupied;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff20 [16];
  ulong local_40;
  ulong local_38;
  long local_30;
  long local_28;
  undefined8 local_20 [4];
  
  local_38 = in_R8 + in_R9;
  if (local_38 < *(ulong *)(in_RDI + 0x50)) {
    uVar1 = *(long *)(in_RDI + 0x50) - local_38;
  }
  else {
    uVar1 = 0;
  }
  local_40 = uVar1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20[0] = in_RCX;
  if (uVar1 < 0x14) {
    std::operator<<(in_RSI,"\n\n");
    local_40 = *(long *)(in_RDI + 0x50) - 0x14;
    local_20[0] = 0;
    local_28 = 0x14;
    local_30 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::cbegin(in_stack_fffffffffffffec8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::cend(in_stack_fffffffffffffec8);
  __f.to = (OutStreamType *)in_RDI;
  __f.makeOffset = (bool *)&local_40;
  __f.currentPos = (size_type *)&local_30;
  __f.leftMargin = (size_type *)in_stack_ffffffffffffff08;
  __f.length = (size_type *)uVar1;
  __f.maxLineLength = (size_type *)in_RDI;
  __f.this = (HelpPrinter *)in_stack_ffffffffffffff20._0_8_;
  __f.rightMargin = (size_type *)in_stack_ffffffffffffff20._8_8_;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Args::HelpPrinter::printString(std::ostream&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long,unsigned_long)const::_lambda(std::__cxx11::string_const&)_1_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,__f);
  return;
}

Assistant:

inline void
HelpPrinter::printString( OutStreamType & to,
	const StringList & words,
	String::size_type currentPos, String::size_type leftMargin,
	String::size_type rightMargin ) const
{
	const String::size_type occupied = leftMargin + rightMargin;

	String::size_type maxLineLength = ( occupied < m_lineLength ?
		m_lineLength - occupied : 0 );

	if( maxLineLength < 20 )
	{
		to << "\n\n";

		maxLineLength = m_lineLength - 20;

		currentPos = 0;
		leftMargin = 20;
		rightMargin = 0;
	}

	String::size_type length = 0;

	bool makeOffset = ( currentPos < leftMargin );

	std::for_each( words.cbegin(), words.cend(),
		[ & ] ( const String & word )
		{
			if( makeOffset )
			{
				printOffset( to, currentPos, leftMargin );

				makeOffset = false;
			}

			if( length + word.length() < maxLineLength )
			{
				length += word.length();

				to << word;

				if( length < maxLineLength )
				{
					++length;
					to << ' ';
				}
			}
			else
			{
				currentPos = 0;

				length = 0;

				maxLineLength = m_lineLength - leftMargin - rightMargin;

				to << "\n";

				printOffset( to, currentPos, leftMargin );

				to << word;

				length += word.length();

				if( length < maxLineLength )
				{
					++length;
					to << ' ';
				}
			}
		}
	);
}